

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
reset(basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this)

{
  pointer puVar1;
  pointer ppVar2;
  int local_c [3];
  
  this->more_ = true;
  this->done_ = false;
  puVar1 = (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  (this->name_buffer_)._M_string_length = 0;
  *(this->name_buffer_)._M_dataplus._M_p = '\0';
  (this->text_buffer_)._M_string_length = 0;
  *(this->text_buffer_)._M_dataplus._M_p = '\0';
  ppVar2 = (this->state_stack_).
           super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->state_stack_).
    super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  local_c[2] = 0;
  local_c[1] = 0;
  local_c[0] = 0;
  std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
  emplace_back<jsoncons::bson::parse_mode,int,int>
            ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
             &this->state_stack_,(parse_mode *)(local_c + 2),local_c + 1,local_c);
  return;
}

Assistant:

void reset()
    {
        more_ = true;
        done_ = false;
        bytes_buffer_.clear();
        name_buffer_.clear();
        text_buffer_.clear();
        state_stack_.clear();
        state_stack_.emplace_back(parse_mode::root,0,0);
    }